

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O0

void mserialize::detail::BuiltinDeserializer<std::deque<char,_std::allocator<char>_>,_void>::
     deserialize_elems_noinsert<InputStream>
               (undefined8 param_1,undefined4 param_2,undefined8 param_3)

{
  bool bVar1;
  char *elem;
  iterator __end0;
  iterator __begin0;
  deque<char,_std::allocator<char>_> *__range3;
  _Self *in_stack_ffffffffffffff88;
  _Deque_iterator<char,_char_&,_char_*> *in_stack_ffffffffffffff90;
  _Deque_iterator<char,_char_&,_char_*> local_48;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_14;
  undefined8 local_10;
  
  local_28 = param_1;
  local_20 = param_3;
  local_14 = param_2;
  local_10 = param_1;
  std::deque<char,_std::allocator<char>_>::begin
            ((deque<char,_std::allocator<char>_> *)in_stack_ffffffffffffff88);
  std::deque<char,_std::allocator<char>_>::end
            ((deque<char,_std::allocator<char>_> *)in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = std::operator!=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (!bVar1) break;
    in_stack_ffffffffffffff90 =
         (_Deque_iterator<char,_char_&,_char_*> *)
         std::_Deque_iterator<char,_char_&,_char_*>::operator*(&local_48);
    deserialize<char,InputStream>
              ((char *)in_stack_ffffffffffffff90,(InputStream *)in_stack_ffffffffffffff88);
    std::_Deque_iterator<char,_char_&,_char_*>::operator++(in_stack_ffffffffffffff90);
  }
  return;
}

Assistant:

static void deserialize_elems_noinsert(
    std::false_type /* no batch deserialization */,
    std::false_type /* not a proxy sequence */,
    Sequence& s, std::uint32_t /*size*/, InputStream& istream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::deserialize(elem, istream);
    }
  }